

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::json_abi_v3_11_3::detail::
         serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
         ::hex_bytes(uint8_t byte)

{
  reference pvVar1;
  byte in_SIL;
  string *in_RDI;
  char *nibble_to_hex;
  string *result;
  size_type in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  char cVar2;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_b;
  undefined1 local_a;
  byte local_9;
  
  local_a = 0;
  __a = &local_b;
  local_9 = in_SIL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
  std::allocator<char>::~allocator((allocator<char> *)&local_b);
  cVar2 = "0123456789ABCDEF"[local_9 >> 4];
  pvVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  *pvVar1 = cVar2;
  cVar2 = "0123456789ABCDEF"[local_9 & 0xf];
  pvVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(cVar2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  *pvVar1 = cVar2;
  return in_RDI;
}

Assistant:

static std::string hex_bytes(std::uint8_t byte)
    {
        std::string result = "FF";
        constexpr const char* nibble_to_hex = "0123456789ABCDEF";
        result[0] = nibble_to_hex[byte / 16];
        result[1] = nibble_to_hex[byte % 16];
        return result;
    }